

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter.c
# Opt level: O1

void xml_show_skip(TestReporter *reporter,char *file,int line)

{
  xmlTextWriterStartElement(child_output_writer,"skipped");
  xmlTextWriterEndElement(child_output_writer);
  xmlTextWriterFlush(child_output_writer);
  return;
}

Assistant:

static void xml_show_skip(TestReporter *reporter, const char *file, int line) {
    (void)file;
    (void)line;
    (void)reporter;

    xmlTextWriterStartElement(child_output_writer, XMLSTRING("skipped"));
    xmlTextWriterEndElement(child_output_writer); // </skipped>
    xmlTextWriterFlush(child_output_writer);
}